

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse_new.hpp
# Opt level: O2

const_reference_value __thiscall
Disa::Matrix_Sparse_Row::SparseAccessor::operator_cast_to_double_(SparseAccessor *this)

{
  long lVar1;
  __normal_iterator<int_*,_std::span<int,_18446744073709551615UL>_> _Var2;
  ostream *poVar3;
  source_location *location;
  string sStack_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  lVar1 = *(long *)(*(long *)this + 0x10);
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<int*,std::span<int,18446744073709551615ul>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                    (lVar1,lVar1 + *(long *)(*(long *)this + 0x18) * 4,this + 8);
  location = *(source_location **)this;
  if (_Var2._M_current !=
      (int *)((long)&(location[2]._M_impl)->_M_file_name + (long)location[3]._M_impl * 4)) {
    return (const_reference_value)
           (((long)_Var2._M_current - (long)location[2]._M_impl) * 2 + (long)location[4]._M_impl);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
  local_48 = &PTR_s__workspace_llm4binary_github_lic_001555e0;
  console_format_abi_cxx11_(&local_40,(Disa *)0x0,(Log_Level)&local_48,location);
  poVar3 = std::operator<<(poVar3,(string *)&local_40);
  std::__cxx11::to_string
            (&local_e8,
             (int)((ulong)((*(undefined8 **)this)[1] - *(long *)**(undefined8 **)this) >> 2));
  std::operator+(&local_c8,"Attempting to implicitly insert an new element at (",&local_e8);
  std::operator+(&local_a8,&local_c8,", ");
  std::__cxx11::to_string(&sStack_108,*(int *)(this + 8));
  std::operator+(&local_88,&local_a8,&sStack_108);
  std::operator+(&local_68,&local_88,") must use explicit assignment operator.");
  poVar3 = std::operator<<(poVar3,(string *)&local_68);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&sStack_108);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_40);
  exit(1);
}

Assistant:

[[nodiscard]] operator const_reference_value() const {
      auto iter = std::find(row_.i_column.begin(), row_.i_column.end(), i_column);
      ASSERT_DEBUG(iter != row_.i_column.end(), "Attempting to implicitly insert an new element at (" +
                                                std::to_string(row_.row()) + ", " + std::to_string(i_column) +
                                                ") must use explicit assignment operator.");
      return *(row_.value.begin() + std::distance(row_.i_column.begin(), iter));
    }